

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

LibraryPtr __thiscall Jinx::Impl::Runtime::GetLibrary(Runtime *this,String *name)

{
  bool bVar1;
  pointer ppVar2;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  LibraryPtr LVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>
  local_a0;
  undefined1 local_70 [23];
  undefined1 local_59;
  undefined1 local_58 [8];
  shared_ptr<Jinx::Impl::Library> library;
  _Self local_30;
  iterator itr;
  lock_guard<std::mutex> lock;
  String *name_local;
  Runtime *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&itr,(mutex_type *)&name[0x81].field_2);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
               *)((long)&name[0x82].field_2 + 8),in_RDX);
  library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
              *)((long)&name[0x82].field_2 + 8));
  bVar1 = std::operator==(&local_30,
                          (_Self *)&library.
                                    super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
  if (bVar1) {
    Allocator<Jinx::Impl::Library>::Allocator((Allocator<Jinx::Impl::Library> *)&local_59);
    std::enable_shared_from_this<Jinx::Impl::Runtime>::shared_from_this
              ((enable_shared_from_this<Jinx::Impl::Runtime> *)local_70);
    std::
    allocate_shared<Jinx::Impl::Library,Jinx::Allocator<Jinx::Impl::Library>,std::shared_ptr<Jinx::Impl::Runtime>,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const&>
              ((Allocator<Jinx::Impl::Library> *)local_58,
               (shared_ptr<Jinx::Impl::Runtime> *)&local_59,
               (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_70);
    std::shared_ptr<Jinx::Impl::Runtime>::~shared_ptr((shared_ptr<Jinx::Impl::Runtime> *)local_70);
    std::
    make_pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const&,std::shared_ptr<Jinx::Impl::Library>&>
              (&local_a0,in_RDX,(shared_ptr<Jinx::Impl::Library> *)local_58);
    std::
    map<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::shared_ptr<Jinx::Impl::Library>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,4096ul,16ul>>
    ::
    insert<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::shared_ptr<Jinx::Impl::Library>>>
              ((map<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>,std::shared_ptr<Jinx::Impl::Library>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,Jinx::StaticAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>const,std::shared_ptr<Jinx::Impl::Library>>,4096ul,16ul>>
                *)(name[0x82].field_2._M_local_buf + 8),&local_a0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>
    ::~pair(&local_a0);
    std::shared_ptr<Jinx::ILibrary>::shared_ptr<Jinx::Impl::Library,void>
              ((shared_ptr<Jinx::ILibrary> *)this,(shared_ptr<Jinx::Impl::Library> *)local_58);
    std::shared_ptr<Jinx::Impl::Library>::~shared_ptr((shared_ptr<Jinx::Impl::Library> *)local_58);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>_>
             ::operator->(&local_30);
    std::shared_ptr<Jinx::ILibrary>::shared_ptr<Jinx::Impl::Library,void>
              ((shared_ptr<Jinx::ILibrary> *)this,&ppVar2->second);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&itr);
  LVar3.super___shared_ptr<Jinx::ILibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  LVar3.super___shared_ptr<Jinx::ILibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (LibraryPtr)LVar3.super___shared_ptr<Jinx::ILibrary,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t LibraryPtr Runtime::GetLibrary(const String & name)
	{
		std::lock_guard<std::mutex> lock(m_libraryMutex);
		auto itr = m_libraryMap.find(name);
		if (itr == m_libraryMap.end())
		{
			auto library = std::allocate_shared<Library>(Allocator<Library>(), shared_from_this(), name);
			m_libraryMap.insert(std::make_pair(name, library));
			return library;
		}
		return itr->second;
	}